

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_PlaneEquation * __thiscall
ON_PlaneEquation::UnitizedPlaneEquation
          (ON_PlaneEquation *__return_storage_ptr__,ON_PlaneEquation *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  ON_PlaneEquation tmp;
  ON_PlaneEquation local_38;
  
  bVar3 = IsSet(this);
  if (bVar3) {
    dVar4 = ON_Length3d(this->x,this->y,this->z);
    if (0x7fefffffffffffff < (ulong)ABS(dVar4)) goto LAB_005850fb;
    if (2.2250738585072014e-308 < dVar4) {
      local_38.x = this->x / dVar4;
      local_38.y = this->y / dVar4;
      local_38.z = this->z / dVar4;
      local_38.d = this->d;
    }
    else {
      if (dVar4 <= 0.0) {
LAB_005850fb:
        dVar2 = ZeroPlaneEquation.d;
        dVar1 = ZeroPlaneEquation.y;
        dVar4 = ZeroPlaneEquation.x;
        __return_storage_ptr__->z = ZeroPlaneEquation.z;
        __return_storage_ptr__->d = dVar2;
        __return_storage_ptr__->x = dVar4;
        __return_storage_ptr__->y = dVar1;
        return __return_storage_ptr__;
      }
      ON_PlaneEquation(&local_38,this->x * 8.98846567431158e+307,this->y * 8.98846567431158e+307,
                       this->z * 8.98846567431158e+307,this->d * 8.98846567431158e+307);
      dVar4 = ON_Length3d(local_38.x,local_38.y,local_38.z);
      if (dVar4 <= 2.2250738585072014e-308 || 0x7fefffffffffffff < (ulong)ABS(dVar4))
      goto LAB_005850fb;
      local_38.x = local_38.x / dVar4;
      local_38.y = local_38.y / dVar4;
      local_38.z = local_38.z / dVar4;
    }
    local_38.d = local_38.d / dVar4;
  }
  else {
    if ((((this->d != -1.23432101234321e+308) || (NAN(this->d))) ||
        (ON_3dVector::ON_3dVector((ON_3dVector *)&local_38,this->x,this->y,this->z),
        1.23432101234321e+308 <= ABS(local_38.x))) ||
       (((1.23432101234321e+308 <= ABS(local_38.y) || (1.23432101234321e+308 <= ABS(local_38.z))) ||
        (bVar3 = ON_3dVector::Unitize((ON_3dVector *)&local_38), !bVar3)))) goto LAB_005850fb;
    local_38.d = -1.23432101234321e+308;
  }
  ON_PlaneEquation(__return_storage_ptr__,local_38.x,local_38.y,local_38.z,local_38.d);
  return __return_storage_ptr__;
}

Assistant:

ON_PlaneEquation ON_PlaneEquation::UnitizedPlaneEquation() const
{
  if (IsSet())
  {
    // 15 September 2003 Dale Lear
    //     Added the ON_IS_FINITE and ON_DBL_MIN test.  See ON_3dVector::Length()
    //     for details.
    double dd = DirectionLength();

    if (ON_IS_FINITE(dd))
    {
      if (dd > ON_DBL_MIN)
      {
        return ON_PlaneEquation(x / dd, y / dd, z / dd, d / dd);
      }

      if (dd > 0.0)
      {
        // This code is rarely used and can be slow.
        // It multiplies by 2^1023 in an attempt to 
        // normalize the coordinates.
        // If the renormalization works, then we're
        // ok.  If the renormalization fails, we
        // return false.
        ON_PlaneEquation tmp(
          x*8.9884656743115795386465259539451e+307,
          y*8.9884656743115795386465259539451e+307,
          z*8.9884656743115795386465259539451e+307,
          d*8.9884656743115795386465259539451e+307
          );
        dd = tmp.DirectionLength();
        if (ON_IS_FINITE(dd) && dd > ON_DBL_MIN)
        {
          return ON_PlaneEquation(tmp.x / dd, tmp.y / dd, tmp.z / dd, tmp.d / dd);
        }
      }
    }
  }
  else if ( d == ON_UNSET_VALUE )
  {
    ON_3dVector v = Direction();
    if (v.IsValid() && v.Unitize())
    {
      return ON_PlaneEquation(v.x, v.y, v.z, ON_UNSET_VALUE);
    }
  }

  return ON_PlaneEquation::ZeroPlaneEquation;
}